

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O1

size_t __thiscall AggRegTuple_hash::operator()(AggRegTuple_hash *this,AggRegTuple *key)

{
  ulong uVar1;
  
  uVar1 = (key->previous).first + 0x9e3779b9;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->previous).second ^ uVar1;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + (uVar1 << 6 | (ulong)(key->product).first) ^ uVar1;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->product).second ^ uVar1;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + (uVar1 << 6 | (ulong)(key->view).first) ^ uVar1;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->view).second ^ uVar1;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->viewAgg).first ^ uVar1;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->viewAgg).second ^ uVar1;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->postLoop).first ^ uVar1;
  return (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->postLoop).second ^ uVar1;
}

Assistant:

size_t operator()(const AggRegTuple &key ) const
    {
        size_t h = 0;
        h ^= std::hash<size_t>()(key.previous.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.previous.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<bool>()(key.product.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.product.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<bool>()(key.view.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.view.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.viewAgg.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.viewAgg.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        // h ^= std::hash<size_t>()(key.localAgg.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        // h ^= std::hash<size_t>()(key.localAgg.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.postLoop.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.postLoop.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        return h;
    }